

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

pcut_item_t * pcut_fix_list_get_real_head(pcut_item_t *last)

{
  pcut_item_t *ppVar1;
  pcut_item_t *ppVar2;
  int iVar3;
  pcut_extra_t *ppVar4;
  
  last->next = (pcut_item_t *)0x0;
  inline_nested_lists(last);
  ppVar1 = last->previous;
  while (ppVar2 = ppVar1, ppVar2 != (pcut_item_t *)0x0) {
    ppVar2->next = last;
    inline_nested_lists(ppVar2);
    last = ppVar2;
    ppVar1 = ppVar2->previous;
  }
  iVar3 = last->kind;
  ppVar1 = last;
  while (ppVar2 = last, iVar3 == 0) {
    ppVar1 = ppVar1->next;
    if (ppVar1 == (pcut_item_t *)0x0) {
      do {
        ppVar2 = ppVar2->next;
        if (ppVar2 == (pcut_item_t *)0x0) {
          return last;
        }
        iVar3 = ppVar2->kind;
joined_r0x00102628:
      } while (iVar3 == 0);
      iVar3 = 1;
      do {
        ppVar2->id = iVar3;
        iVar3 = iVar3 + 1;
        do {
          ppVar2 = ppVar2->next;
          if (ppVar2 == (pcut_item_t *)0x0) {
            return last;
          }
        } while (ppVar2->kind == 0);
      } while( true );
    }
    iVar3 = ppVar1->kind;
  }
  do {
    if (iVar3 == 5) {
      for (ppVar4 = ppVar1->extras; ppVar4->type != 2; ppVar4 = ppVar4 + 1) {
        if (ppVar4->type == 1) {
          ppVar1->kind = 0;
          break;
        }
      }
    }
    do {
      ppVar1 = ppVar1->next;
      if (ppVar1 == (pcut_item_t *)0x0) {
        iVar3 = last->kind;
        goto joined_r0x00102628;
      }
      iVar3 = ppVar1->kind;
    } while (iVar3 == 0);
  } while( true );
}

Assistant:

pcut_item_t *pcut_fix_list_get_real_head(pcut_item_t *last) {
	pcut_item_t *next, *it;

	last->next = NULL;

	inline_nested_lists(last);

	next = last;
	it = last->previous;
	while (it != NULL) {
		it->next = next;
		inline_nested_lists(it);
		next = it;
		it = it->previous;
	}

	detect_skipped_tests(next);

	set_ids(next);

	return next;
}